

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void C_DoCommand(char *cmd,int keynum)

{
  int iVar1;
  uint key;
  size_t __n;
  FConsoleCommand *command;
  DStoredCommand *this;
  undefined8 uVar2;
  char *pcVar3;
  bool bVar4;
  undefined1 local_b0 [8];
  FCommandLine args_1;
  FBaseCVar *var;
  undefined1 local_70 [8];
  FCommandLine args;
  FButtonStatus *button;
  int i;
  size_t len;
  char *beg;
  char *end;
  FConsoleCommand *com;
  char *pcStack_10;
  int keynum_local;
  char *cmd_local;
  
  pcStack_10 = cmd;
  while( true ) {
    bVar4 = false;
    if (*pcStack_10 != '\0') {
      bVar4 = *pcStack_10 < '!';
    }
    if (!bVar4) break;
    pcStack_10 = pcStack_10 + 1;
  }
  if (*pcStack_10 == '\"') {
    len = (size_t)(pcStack_10 + 1);
    beg = (char *)len;
    while( true ) {
      bVar4 = false;
      if (*beg != '\0') {
        bVar4 = *beg != '\"';
      }
      if (!bVar4) break;
      beg = beg + 1;
    }
  }
  else {
    len = (size_t)pcStack_10;
    do {
      beg = pcStack_10 + 1;
      pcStack_10 = beg;
    } while (' ' < *beg);
  }
  __n = (long)beg - len;
  if (ParsingKeyConf) {
    button._4_4_ = 8;
    while ((-1 < button._4_4_ &&
           ((iVar1 = strncasecmp((char *)len,KeyConfCommands[button._4_4_],__n), iVar1 != 0 ||
            (KeyConfCommands[button._4_4_][__n] != '\0'))))) {
      button._4_4_ = button._4_4_ + -1;
    }
    if (button._4_4_ < 0) {
      Printf("Invalid command for KEYCONF: %s\n",len);
      return;
    }
  }
  if ((*(char *)len == '+') || (*(char *)len == '-')) {
    key = MakeKey((char *)(len + 1),(size_t)(beg + (-1 - len)));
    args._32_8_ = FindButton(key);
    if ((FButtonStatus *)args._32_8_ != (FButtonStatus *)0x0) {
      if (*(char *)len == '+') {
        FButtonStatus::PressKey((FButtonStatus *)args._32_8_,keynum);
        return;
      }
      FButtonStatus::ReleaseKey((FButtonStatus *)args._32_8_,keynum);
      if ((FButtonStatus *)args._32_8_ != &Button_Mlook) {
        return;
      }
      bVar4 = FBoolCVar::operator_cast_to_bool(&lookspring);
      if (!bVar4) {
        return;
      }
      Net_WriteByte('$');
      return;
    }
    args.noescapes = false;
    args._33_7_ = 0;
  }
  pcVar3 = (char *)len;
  command = FindNameInHashTable(Commands,(char *)len,__n);
  if (command == (FConsoleCommand *)0x0) {
    args_1._32_8_ = FindCVarSub((char *)len,(int)__n);
    if ((FBaseCVar *)args_1._32_8_ != (FBaseCVar *)0x0) {
      FCommandLine::FCommandLine((FCommandLine *)local_b0,(char *)len,false);
      iVar1 = FCommandLine::argc((FCommandLine *)local_b0);
      uVar2 = args_1._32_8_;
      if (iVar1 < 2) {
        pcVar3 = FBaseCVar::GetName((FBaseCVar *)args_1._32_8_);
        uVar2 = (**(code **)(*(long *)args_1._32_8_ + 0x18))(args_1._32_8_,0xffffffff);
        Printf("\"%s\" is \"%s\"\n",pcVar3,uVar2);
      }
      else {
        pcVar3 = FCommandLine::operator[]((FCommandLine *)local_b0,1);
        FBaseCVar::CmdSet((FBaseCVar *)uVar2,pcVar3);
      }
      FCommandLine::~FCommandLine((FCommandLine *)local_b0);
      return;
    }
    Printf("Unknown command \"%.*s\"\n",__n & 0xffffffff,len);
    return;
  }
  if ((gamestate == GS_STARTUP) && ((ParsingKeyConf & 1U) == 0)) {
    if (__n == 3) {
      pcVar3 = "set";
      iVar1 = strncasecmp((char *)len,"set",3);
      if (iVar1 == 0) goto LAB_0044c0e8;
    }
    if (__n == 7) {
      pcVar3 = "logfile";
      iVar1 = strncasecmp((char *)len,"logfile",7);
      if (iVar1 == 0) goto LAB_0044c0e8;
    }
    if (__n == 9) {
      pcVar3 = "unbindall";
      iVar1 = strncasecmp((char *)len,"unbindall",9);
      if (iVar1 == 0) goto LAB_0044c0e8;
    }
    if (__n == 4) {
      pcVar3 = "bind";
      iVar1 = strncasecmp((char *)len,"bind",4);
      if (iVar1 == 0) goto LAB_0044c0e8;
    }
    if (__n == 4) {
      pcVar3 = "exec";
      iVar1 = strncasecmp((char *)len,"exec",4);
      if (iVar1 == 0) goto LAB_0044c0e8;
    }
    if (__n == 10) {
      pcVar3 = "doublebind";
      iVar1 = strncasecmp((char *)len,"doublebind",10);
      if (iVar1 == 0) goto LAB_0044c0e8;
    }
    if (__n == 6) {
      pcVar3 = "pullin";
      iVar1 = strncasecmp((char *)len,"pullin",6);
      if (iVar1 == 0) goto LAB_0044c0e8;
    }
    if (__n == 4) {
      pcVar3 = "warp";
      iVar1 = strncasecmp((char *)len,"warp",4);
      if (iVar1 == 0) {
        FString::operator=(&StoredWarp,(char *)len);
        return;
      }
    }
    this = (DStoredCommand *)DObject::operator_new((DObject *)0x48,(size_t)pcVar3);
    DStoredCommand::DStoredCommand(this,command,(char *)len);
  }
  else {
LAB_0044c0e8:
    FCommandLine::FCommandLine((FCommandLine *)local_70,(char *)len,false);
    (*command->_vptr_FConsoleCommand[3])
              (command,(FCommandLine *)local_70,(&players)[(long)consoleplayer * 0x54],
               (ulong)(uint)keynum);
    FCommandLine::~FCommandLine((FCommandLine *)local_70);
  }
  return;
}

Assistant:

void C_DoCommand (const char *cmd, int keynum)
{
	FConsoleCommand *com;
	const char *end;
	const char *beg;

	// Skip any beginning whitespace
	while (*cmd && *cmd <= ' ')
		cmd++;

	// Find end of the command name
	if (*cmd == '\"')
	{
		for (end = beg = cmd+1; *end && *end != '\"'; ++end)
			;
	}
	else
	{
		beg = cmd;
		for (end = cmd+1; *end > ' '; ++end)
			;
	}

	const size_t len = end - beg;

	if (ParsingKeyConf)
	{
		int i;

		for (i = countof(KeyConfCommands)-1; i >= 0; --i)
		{
			if (strnicmp (beg, KeyConfCommands[i], len) == 0 &&
				KeyConfCommands[i][len] == 0)
			{
				break;
			}
		}
		if (i < 0)
		{
			Printf ("Invalid command for KEYCONF: %s\n", beg);
			return;
		}
	}

	// Check if this is an action
	if (*beg == '+' || *beg == '-')
	{
		FButtonStatus *button;

		button = FindButton (MakeKey (beg + 1, end - beg - 1));
		if (button != NULL)
		{
			if (*beg == '+')
			{
				button->PressKey (keynum);
			}
			else
			{
				button->ReleaseKey (keynum);
				if (button == &Button_Mlook && lookspring)
				{
					Net_WriteByte (DEM_CENTERVIEW);
				}
			}
			return;
		}
	}
	
	// Parse it as a normal command
	// Checking for matching commands follows this search order:
	//	1. Check the Commands[] hash table
	//	2. Check the CVars list

	if ( (com = FindNameInHashTable (Commands, beg, len)) )
	{
		if (gamestate != GS_STARTUP || ParsingKeyConf ||
			(len == 3 && strnicmp (beg, "set", 3) == 0) ||
			(len == 7 && strnicmp (beg, "logfile", 7) == 0) ||
			(len == 9 && strnicmp (beg, "unbindall", 9) == 0) ||
			(len == 4 && strnicmp (beg, "bind", 4) == 0) ||
			(len == 4 && strnicmp (beg, "exec", 4) == 0) ||
			(len ==10 && strnicmp (beg, "doublebind", 10) == 0) ||
			(len == 6 && strnicmp (beg, "pullin", 6) == 0)
			)
		{
			FCommandLine args (beg);
			com->Run (args, players[consoleplayer].mo, keynum);
		}
		else
		{
			if (len == 4 && strnicmp(beg, "warp", 4) == 0)
			{
				StoredWarp = beg;
			}
			else
			{
				new DStoredCommand (com, beg);
			}
		}
	}
	else
	{ // Check for any console vars that match the command
		FBaseCVar *var = FindCVarSub (beg, int(len));

		if (var != NULL)
		{
			FCommandLine args (beg);

			if (args.argc() >= 2)
			{ // Set the variable
				var->CmdSet (args[1]);
			}
			else
			{ // Get the variable's value
				Printf ("\"%s\" is \"%s\"\n", var->GetName(), var->GetHumanString());
			}
		}
		else
		{ // We don't know how to handle this command
			Printf ("Unknown command \"%.*s\"\n", (int)len, beg);
		}
	}
}